

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O2

int32_t helicsDataBufferFillFromRawString(HelicsDataBuffer data,char *str,int stringSize)

{
  SmallBuffer *store;
  int32_t iVar1;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  store = getBuffer(data);
  iVar1 = 0;
  if (store != (SmallBuffer *)0x0) {
    local_30._M_len = (size_t)stringSize;
    local_30._M_str = str;
    helics::ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (&local_30,store);
    iVar1 = (int32_t)store->bufferSize;
  }
  return iVar1;
}

Assistant:

HELICS_EXPORT int32_t helicsDataBufferFillFromRawString(HelicsDataBuffer data, const char* str, int stringSize)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    try {
        helics::ValueConverter<std::string_view>::convert(std::string_view(str, stringSize), *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}